

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseFieldList
          (WastParser *this,vector<wabt::Field,_std::allocator<wabt::Field>_> *fields)

{
  bool bVar1;
  Result RVar2;
  Field field;
  
  while ((bVar1 = PeekMatch(this,First_Type), bVar1 || (bVar1 = PeekMatch(this,Lpar), bVar1))) {
    field.name._M_string_length = 0;
    field.name.field_2._M_local_buf[0] = '\0';
    field.type.enum_ = Void;
    field.mutable_ = false;
    field.name._M_dataplus._M_p = (pointer)&field.name.field_2;
    RVar2 = ParseField(this,&field);
    if (RVar2.enum_ == Error) {
      std::__cxx11::string::_M_dispose();
      return (Result)Error;
    }
    std::vector<wabt::Field,_std::allocator<wabt::Field>_>::push_back(fields,&field);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseFieldList(std::vector<Field>* fields) {
  WABT_TRACE(ParseFieldList);
  while (PeekMatch(TokenType::ValueType) || PeekMatch(TokenType::Lpar)) {
    Field field;
    CHECK_RESULT(ParseField(&field));
    fields->push_back(field);
  }
  return Result::Ok;
}